

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O0

void __thiscall CmdLineArgsParser::ParseNumberRange(CmdLineArgsParser *this,NumberRange *pRange)

{
  char16 cVar1;
  int i;
  int j;
  Exception *pEVar2;
  int end;
  int start;
  NumberRange *pRange_local;
  CmdLineArgsParser *this_local;
  
  i = ParseInteger(this);
  cVar1 = CurChar(this);
  if ((cVar1 == L'\0') || (cVar1 == L' ')) {
    Js::RangeBase<int>::Add(&pRange->super_RangeBase<int>,i,(RangeBase<int> *)0x0);
  }
  else if (cVar1 == L',') {
    Js::RangeBase<int>::Add(&pRange->super_RangeBase<int>,i,(RangeBase<int> *)0x0);
    NextChar(this);
    ParseNumberRange(this,pRange);
  }
  else {
    if (cVar1 != L'-') {
      pEVar2 = (Exception *)__cxa_allocate_exception(8);
      Exception::Exception(pEVar2,L"Unexpected character while parsing Range");
      __cxa_throw(pEVar2,&Exception::typeinfo,0);
    }
    NextChar(this);
    j = ParseInteger(this);
    if (j < i) {
      pEVar2 = (Exception *)__cxa_allocate_exception(8);
      Exception::Exception(pEVar2,L"Range start must be less than range end");
      __cxa_throw(pEVar2,&Exception::typeinfo,0);
    }
    Js::RangeBase<int>::Add(&pRange->super_RangeBase<int>,i,j,(RangeBase<int> *)0x0);
    cVar1 = CurChar(this);
    if ((cVar1 != L'\0') && (cVar1 != L' ')) {
      if (cVar1 != L',') {
        pEVar2 = (Exception *)__cxa_allocate_exception(8);
        Exception::Exception(pEVar2,L"Unexpected character while parsing Range");
        __cxa_throw(pEVar2,&Exception::typeinfo,0);
      }
      NextChar(this);
      ParseNumberRange(this,pRange);
    }
  }
  return;
}

Assistant:

void
CmdLineArgsParser::ParseNumberRange(Js::NumberRange *pRange)
{
    int start = ParseInteger();
    int end;

    switch (CurChar())
    {
    case '-':
        NextChar();
        end = ParseInteger();

        if (start > end)
        {
            throw Exception(_u("Range start must be less than range end"));
        }

        pRange->Add(start, end);
        switch (CurChar())
        {
        case ',':
            NextChar();
            ParseNumberRange(pRange);
            break;

        case ' ':
        case 0:
            break;

        default:
            throw Exception(_u("Unexpected character while parsing Range"));
        }
        break;

    case ',':
        pRange->Add(start);
        NextChar();
        ParseNumberRange(pRange);
        break;

    case ' ':
    case 0:
        pRange->Add(start);
        break;

    default:
        throw Exception(_u("Unexpected character while parsing Range"));
    }

}